

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O1

void * cod_extract_state(cod_exec_context ec,int *length_p)

{
  int iVar1;
  void *__dest;
  
  iVar1 = ec->gen_code->static_size_required;
  __dest = malloc((long)iVar1);
  memcpy(__dest,ec->static_data,(long)iVar1);
  *length_p = iVar1;
  return __dest;
}

Assistant:

extern void *cod_extract_state(cod_exec_context ec, int *length_p)
{
    cod_code code = ec->gen_code;
    void *ret = malloc(code->static_size_required);
    /*    
    int i;
    printf("Static block size is %d\n", code->static_size_required);
    for (i=0; i < code->static_size_required; i++) {
	printf(" %02x", ((unsigned char*)ec->static_data)[i]);
    }
    printf("\n");*/
    memcpy(ret, ec->static_data, code->static_size_required);
    *length_p = code->static_size_required;
    /*    *ioformats = code->static_formats;*/
    
    return ret;
}